

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

StringView __thiscall anon_unknown.dwarf_543c74::Db::parseNumber(Db *this,bool AllowNegative)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  StringView SVar4;
  
  pcVar1 = this->First;
  pcVar2 = this->Last;
  pcVar3 = pcVar1;
  if ((pcVar1 != pcVar2 && AllowNegative) && (*pcVar1 == 'n')) {
    pcVar3 = pcVar1 + 1;
    this->First = pcVar3;
  }
  if ((pcVar2 == pcVar3) || (9 < (int)*pcVar3 - 0x30U)) {
    return (StringView)ZEXT816(0);
  }
  do {
    if (9 < (int)*pcVar3 - 0x30U) break;
    pcVar3 = pcVar3 + 1;
    this->First = pcVar3;
  } while (pcVar3 != pcVar2);
  SVar4.Last = pcVar3;
  SVar4.First = pcVar1;
  return SVar4;
}

Assistant:

StringView Db::parseNumber(bool AllowNegative) {
  const char *Tmp = First;
  if (AllowNegative)
    consumeIf('n');
  if (numLeft() == 0 || !std::isdigit(*First))
    return StringView();
  while (numLeft() != 0 && std::isdigit(*First))
    ++First;
  return StringView(Tmp, First);
}